

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint * crnd::crnd_new_array<unsigned_int>(uint32 num)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  
  uVar2 = num + (num == 0);
  puVar3 = (uint *)0x0;
  puVar1 = (uint *)crnd_malloc((ulong)uVar2 * 4 + 8,(size_t *)0x0);
  if (puVar1 != (uint *)0x0) {
    puVar3 = puVar1 + 2;
    puVar1[1] = uVar2;
    *puVar1 = ~uVar2;
  }
  return puVar3;
}

Assistant:

inline T* crnd_new_array(uint32 num)
    {
        if (!num)
            num = 1;

        uint8* q = static_cast<uint8*>(crnd_malloc(CRND_MIN_ALLOC_ALIGNMENT + sizeof(T) * num));
        if (!q)
            return NULL;

        T* p = reinterpret_cast<T*>(q + CRND_MIN_ALLOC_ALIGNMENT);

        reinterpret_cast<uint32*>(p)[-1] = num;
        reinterpret_cast<uint32*>(p)[-2] = ~num;

        helpers::construct_array(p, num);
        return p;
    }